

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O2

void select_test(void)

{
  _Bool _Var1;
  run_container_t *container;
  uint16_t value;
  ushort pos;
  int iVar2;
  uint16_t value_1;
  unsigned_long b;
  uint32_t element;
  uint32_t local_34;
  
  container = run_container_create();
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
               ,0x99);
  for (pos = 0x1b; pos < 0xe3; pos = pos + 5) {
    run_container_add(container,pos);
  }
  _element = 0;
  iVar2 = 0;
  for (b = 0x1b; _element = CONCAT44(0xc,element), (int)b != 0xe3; b = b + 5) {
    _Var1 = run_container_select(container,&local_34,iVar2 + 0xc,&element);
    _assert_true((ulong)_Var1,"run_container_select(B, &start_rank, i + 12, &element)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                 ,0xa3);
    _assert_int_equal(_element & 0xffffffff,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                      ,0xa4);
    iVar2 = iVar2 + 1;
  }
  _Var1 = run_container_select(container,&local_34,0x34,&element);
  _assert_true((ulong)!_Var1,"run_container_select(B, &start_rank, i + 12, &element)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
               ,0xa8);
  _assert_int_equal(_element >> 0x20,0x34,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                    ,0xa9);
  run_container_free(container);
  return;
}

Assistant:

DEFINE_TEST(select_test) {
    run_container_t* B = run_container_create();
    assert_non_null(B);
    uint16_t base = 27;
    for (uint16_t value = base; value < base + 200; value += 5) {
        run_container_add(B, value);
    }
    uint32_t i = 0;
    uint32_t element = 0;
    uint32_t start_rank;
    for (uint16_t value = base; value < base + 200; value += 5) {
        start_rank = 12;
        assert_true(run_container_select(B, &start_rank, i + 12, &element));
        assert_int_equal(element, value);
        i++;
    }
    start_rank = 12;
    assert_false(run_container_select(B, &start_rank, i + 12, &element));
    assert_int_equal(start_rank, i + 12);
    run_container_free(B);
}